

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

void qclab::printMatrix<qclab::dense::SquareMatrix<std::complex<double>>>
               (SquareMatrix<std::complex<double>_> *mat)

{
  char cVar1;
  SquareMatrix<std::complex<double>_> *this;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong in_RSI;
  ulong uVar2;
  ulong uVar3;
  complex<double> val;
  
  if (mat->size_ != 0) {
    uVar3 = 0;
    this = mat;
    do {
      if (mat->size_ != 0) {
        uVar2 = 0;
        do {
          val._M_value._8_8_ = in_RDX;
          val._M_value._0_8_ = in_RSI;
          print<double>((qclab *)this,val);
          uVar2 = uVar2 + 1;
          in_RDX = extraout_RDX;
        } while (uVar2 < (ulong)mat->size_);
      }
      cVar1 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      in_RSI = (ulong)(uint)(int)cVar1;
      this = (SquareMatrix<std::complex<double>_> *)std::ostream::put('\b');
      std::ostream::flush();
      uVar3 = uVar3 + 1;
      in_RDX = extraout_RDX_00;
    } while (uVar3 < (ulong)mat->size_);
  }
  return;
}

Assistant:

void printMatrix( const T& mat ) {
   for ( size_t r = 0; r < mat.rows(); ++r ) {
     for ( size_t c = 0; c < mat.cols(); ++c ) {
       print( mat(r,c) ) ;
     }
     std::cout << std::endl ;
   }
 }